

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

basic_json<char,jsoncons::sorted_policy,std::allocator<char>> * __thiscall
jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
get_allocator<std::allocator<char>>
          (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *this)

{
  byte *in_RSI;
  
  for (; (*in_RSI & 0xf) == 9; in_RSI = *(byte **)(in_RSI + 8)) {
  }
  if ((*in_RSI & 0xf) == 0xd) {
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::object_storage::get_allocator
              ((object_storage *)this);
  }
  return this;
}

Assistant:

allocator_type get_allocator() const
        {
            switch (storage_kind())
            {
                case json_storage_kind::long_str:
                    return cast<long_string_storage>().get_allocator();
                case json_storage_kind::byte_str:
                    return cast<byte_string_storage>().get_allocator();
                case json_storage_kind::array:
                    return cast<array_storage>().get_allocator();
                case json_storage_kind::object:
                    return cast<object_storage>().get_allocator();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().get_allocator();
                default:
                    return get_default_allocator(typename std::allocator_traits<U>::is_always_equal());
            }
        }